

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::squeeze
          (View<unsigned_char,_false,_std::allocator<unsigned_long>_> *this)

{
  size_t *psVar1;
  size_t *psVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  runtime_error *this_00;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  
  testInvariant(this);
  if (this->data_ == (pointer)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    sVar9 = (this->geometry_).dimension_;
    if (sVar9 == 0) goto LAB_001074f0;
    if (this->data_ != (pointer)0x0) {
      uVar10 = 0;
      do {
        uVar7 = (this->geometry_).dimension_;
        if (uVar7 <= uVar10) {
          if (sVar9 == uVar7) goto LAB_001074f0;
          if (sVar9 == 0) {
            marray_detail::Geometry<std::allocator<unsigned_long>_>::resize(&this->geometry_,0);
            (this->geometry_).size_ = 1;
            goto LAB_001074f0;
          }
          sVar6 = (this->geometry_).dimension_;
          if (sVar6 == 0) goto LAB_00107419;
          psVar1 = (this->geometry_).shape_;
          psVar2 = (this->geometry_).strides_;
          uVar10 = 0;
          uVar7 = 0;
          goto LAB_001073d5;
        }
        sVar6 = shape(this,uVar10);
        sVar9 = sVar9 - (sVar6 == 1);
        uVar10 = uVar10 + 1;
      } while (this->data_ != (pointer)0x0);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
LAB_00107398:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
LAB_001073d5:
  do {
    sVar3 = psVar1[uVar7];
    if (sVar3 != 1) {
      if (sVar6 <= uVar10) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
        goto LAB_00107398;
      }
      psVar1[uVar10] = sVar3;
      uVar4 = (this->geometry_).dimension_;
      if (uVar4 <= uVar7) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
        goto LAB_00107398;
      }
      if (uVar4 <= uVar10) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
        goto LAB_00107398;
      }
      psVar2[uVar10] = psVar2[uVar7];
      uVar10 = uVar10 + 1;
    }
    uVar7 = uVar7 + 1;
    sVar6 = (this->geometry_).dimension_;
  } while (uVar7 < sVar6);
LAB_00107419:
  marray_detail::Geometry<std::allocator<unsigned_long>_>::resize(&this->geometry_,sVar9);
  sVar9 = (this->geometry_).dimension_;
  if (sVar9 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
    goto LAB_00107398;
  }
  psVar1 = (this->geometry_).shape_;
  psVar2 = (this->geometry_).shapeStrides_;
  if ((this->geometry_).coordinateOrder_ == FirstMajorOrder) {
    psVar2[sVar9 - 1] = 1;
    if (sVar9 != 1) {
      sVar6 = psVar2[sVar9 - 1];
      do {
        sVar6 = sVar6 * psVar1[sVar9 - 1];
        psVar2[sVar9 - 2] = sVar6;
        sVar9 = sVar9 - 1;
      } while (sVar9 != 1);
    }
  }
  else {
    *psVar2 = 1;
    if (sVar9 != 1) {
      sVar6 = *psVar2;
      lVar8 = 0;
      do {
        sVar6 = sVar6 * psVar1[lVar8];
        psVar2[lVar8 + 1] = sVar6;
        lVar8 = lVar8 + 1;
      } while (sVar9 - 1 != lVar8);
    }
  }
  uVar10 = (this->geometry_).dimension_;
  if (uVar10 != 0) {
    psVar1 = (this->geometry_).shapeStrides_;
    psVar2 = (this->geometry_).strides_;
    if (*psVar1 != *psVar2) {
      (this->geometry_).isSimple_ = false;
      goto LAB_001074f0;
    }
    uVar7 = 0;
    do {
      if (uVar10 - 1 == uVar7) goto LAB_001074e6;
      lVar8 = uVar7 + 1;
      uVar4 = uVar7 + 1;
      lVar5 = uVar7 + 1;
      uVar7 = uVar4;
    } while (psVar1[lVar8] == psVar2[lVar5]);
    (this->geometry_).isSimple_ = false;
    if (uVar4 < uVar10) goto LAB_001074f0;
  }
LAB_001074e6:
  (this->geometry_).isSimple_ = true;
LAB_001074f0:
  testInvariant(this);
  return;
}

Assistant:

void
View<T, isConst, A>::squeeze()
{
    testInvariant();
    if(dimension() != 0) {
        std::size_t newDimension = dimension();
        for(std::size_t j=0; j<dimension(); ++j) {
            if(shape(j) == 1) {
                --newDimension;
            }
        }
        if(newDimension != dimension()) {
            if(newDimension == 0) {
                geometry_.resize(0);
                geometry_.size() = 1;
            }
            else {
                for(std::size_t j=0, k=0; j<geometry_.dimension(); ++j) {
                    if(geometry_.shape(j) != 1) {
                        geometry_.shape(k) = geometry_.shape(j);
                        geometry_.strides(k) = geometry_.strides(j);
                        ++k;
                    }
                }
                geometry_.resize(newDimension);
                marray_detail::stridesFromShape(geometry_.shapeBegin(), geometry_.shapeEnd(), 
                    geometry_.shapeStridesBegin(), geometry_.coordinateOrder());
                updateSimplicity();
            }
        }
    }
    testInvariant();
}